

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern.h
# Opt level: O3

int MatchSyntaxPattern(KonohaContext *kctx,kNode *node,KTokenSeq *tokens,KTokenSeq *patterns,
                      kToken **errRuleRef)

{
  long lVar1;
  uint uVar2;
  KClass *pKVar3;
  kToken *pkVar4;
  int beginIdx;
  int iVar5;
  int iVar6;
  kSyntax *syn;
  kNameSpace *pkVar7;
  kNameSpace *pkVar8;
  long lVar9;
  kToken *pkVar10;
  int local_a8;
  KTokenSeq nrule;
  KTokenSeq ntokens;
  
  lVar9 = (long)patterns->beginIdx;
  beginIdx = tokens->beginIdx;
  pKVar3 = *(KClass **)((kctx->share->classTable).field_1.bytebuf + 0x58);
  pkVar7 = (kNameSpace *)node;
  do {
    pkVar8 = (kNameSpace *)pkVar7->importedNameSpaceList;
    if ((((kNameSpace *)pkVar7->importedNameSpaceList)->h).ct == pKVar3) break;
    pkVar7 = *(kNameSpace **)&pkVar7->packageId;
    pkVar8 = pkVar7;
  } while ((pkVar7->h).ct != pKVar3);
  if (patterns->endIdx <= patterns->beginIdx) {
    return beginIdx;
  }
  do {
    lVar1 = lVar9 + 1;
    pkVar10 = (kToken *)(patterns->tokenList->field_2).unboxItems[lVar9];
    do {
      if (tokens->endIdx <= beginIdx) {
        if (patterns->endIdx <= (int)lVar9 + 1) {
          return beginIdx;
        }
        local_a8 = (int)lVar1;
        lVar9 = (long)local_a8;
        while ((pkVar10->symbol == 0x60000008 || (((pkVar10->h).magicflag & 0x100) != 0))) {
          pkVar10 = (kToken *)(patterns->tokenList->field_2).unboxItems[lVar9];
          lVar9 = lVar9 + 1;
          if (patterns->endIdx <= lVar9) {
            return beginIdx;
          }
        }
        *errRuleRef = pkVar10;
        errRuleRef[1] = (kToken *)0x0;
        return -1;
      }
      pkVar4 = (kToken *)(tokens->tokenList->field_2).unboxItems[beginIdx];
      errRuleRef[1] = pkVar4;
      uVar2 = pkVar10->symbol;
      if (uVar2 < 0xe0000000) {
        if (uVar2 == 0x60000008) {
          nrule.tokenList = (pkVar10->field_2).GroupTokenList;
          nrule.beginIdx = 1;
          nrule.endIdx = (int)((nrule.tokenList)->bytesize >> 3) + -1;
          nrule.field_4.SourceConfig.foundErrorToken = (kToken *)0x0;
          nrule.field_4.SourceConfig.openToken = (kToken *)0x0;
          nrule.field_4.TargetPolicy.syntaxSymbolPattern = (kSyntax *)0x0;
          tokens->beginIdx = beginIdx;
          nrule.ns = pkVar8;
          iVar6 = MatchSyntaxPattern(kctx,node,tokens,&nrule,errRuleRef);
          *errRuleRef = (kToken *)0x0;
          if (node->nodeType == 0x18) {
            return tokens->endIdx;
          }
          iVar5 = beginIdx;
          if (iVar6 != -1) {
            iVar5 = iVar6;
          }
        }
        else {
          if (uVar2 != pkVar4->symbol) goto LAB_00118f39;
          if ((pkVar10->field_3).tokenType - 7 < 2) {
            nrule.tokenList = (pkVar10->field_2).GroupTokenList;
            nrule.beginIdx = 1;
            nrule.endIdx = (int)((nrule.tokenList)->bytesize >> 3) + -1;
            nrule.field_4.SourceConfig.foundErrorToken = (kToken *)0x0;
            nrule.field_4.SourceConfig.openToken = (kToken *)0x0;
            nrule.field_4.TargetPolicy.syntaxSymbolPattern = (kSyntax *)0x0;
            ntokens.tokenList = (pkVar4->field_2).GroupTokenList;
            ntokens.beginIdx = 1;
            ntokens.endIdx = (int)((ntokens.tokenList)->bytesize >> 3) + -1;
            ntokens.field_4.SourceConfig.foundErrorToken = (kToken *)0x0;
            ntokens.field_4.SourceConfig.openToken = (kToken *)0x0;
            ntokens.field_4.TargetPolicy.syntaxSymbolPattern = (kSyntax *)0x0;
            nrule.ns = pkVar8;
            ntokens.ns = pkVar8;
            iVar5 = MatchSyntaxPattern(kctx,node,&ntokens,&nrule,errRuleRef);
            if (iVar5 == -1) {
              return -1;
            }
          }
          iVar5 = beginIdx + 1;
        }
      }
      else {
        syn = (*kctx->klib->kNameSpace_GetSyntax)(kctx,pkVar8,uVar2);
        iVar5 = ParseSyntaxNode(kctx,syn,node,(pkVar10->field_6).ruleNameSymbol,tokens->tokenList,
                                beginIdx,-1,tokens->endIdx);
        if (iVar5 == -1) {
          if (((pkVar10->h).magicflag & 0x100) == 0) {
LAB_00118f39:
            *errRuleRef = pkVar10;
            return -1;
          }
          break;
        }
      }
      beginIdx = iVar5;
    } while (((pkVar10->h).magicflag & 0x100) != 0);
    lVar9 = lVar1;
    if (patterns->endIdx <= lVar1) {
      return beginIdx;
    }
  } while( true );
}

Assistant:

static int MatchSyntaxPattern(KonohaContext *kctx, kNode *node, KTokenSeq *tokens, KTokenSeq *patterns, kToken **errRuleRef)
{
	int patternIdx = patterns->beginIdx, tokenIdx = tokens->beginIdx;
	kNameSpace *ns = kNode_ns(node);
	//KLIB dumpTokenArray(kctx, 0, patterns->tokenList, patterns->beginIdx, patterns->endIdx);
	//KLIB dumpTokenArray(kctx, 0, tokens->tokenList, tokens->beginIdx, tokens->endIdx);
	for(; patternIdx < patterns->endIdx; patternIdx++) {
		kToken *ruleToken = patterns->tokenList->TokenItems[patternIdx];
		L_ReDo:;
		//tokenIdx = TokenUtils_SkipOnlyIndent(tokens->tokenList, tokenIdx, tokens->endIdx);
		//DBG_P("patternIdx=%d, tokenIdx=%d, tokenEndIdx=%d", patternIdx, tokenIdx, tokens->endIdx);
		//KDump(node);
		if(tokenIdx < tokens->endIdx) {
			kToken *tk = tokens->tokenList->TokenItems[tokenIdx];
			errRuleRef[1] = tk;
			if(KSymbol_IsPattern(ruleToken->symbol)) {
				kSyntax *syn = kSyntax_(ns, ruleToken->symbol);
				int nextIdx = ParseSyntaxNode(kctx, syn, node, ruleToken->ruleNameSymbol, tokens->tokenList, tokenIdx, -1, tokens->endIdx);
				if(nextIdx == PatternNoMatch) {
					if(!kToken_Is(MatchPreviousPattern, ruleToken)) {
						errRuleRef[0] = ruleToken;
						return PatternNoMatch;
					}
					continue;  /* to avoid check same rule */
				}
				tokenIdx = nextIdx ;
			}
			else if(ruleToken->symbol == KSymbol_OptionalGroup) {
				KTokenSeq nrule = {ns, RangeGroup(ruleToken->GroupTokenList)};
				tokens->beginIdx = tokenIdx;
				int nextIdx = MatchSyntaxPattern(kctx, node, tokens, &nrule, errRuleRef);
				errRuleRef[0] = NULL;
				if(kNode_IsError(node)) return tokens->endIdx;
				if(nextIdx != PatternNoMatch) {
					tokenIdx = nextIdx;
				}
			}
			else {
				if(ruleToken->symbol != tk->symbol) {
					errRuleRef[0] = ruleToken;
					return PatternNoMatch;
				}
				if(ruleToken->tokenType == KSymbol_ParenthesisGroup || ruleToken->tokenType == KSymbol_BracketGroup) {
					KTokenSeq nrule = {ns, RangeGroup(ruleToken->GroupTokenList)};
					KTokenSeq ntokens = {ns, RangeGroup(tk->GroupTokenList)};
					int next = MatchSyntaxPattern(kctx, node, &ntokens, &nrule, errRuleRef);
					if(next == PatternNoMatch) {
						return PatternNoMatch;
					}
				}
				tokenIdx++;
			}
			if(kToken_Is(MatchPreviousPattern, ruleToken)) {
				goto L_ReDo;
			}
		}
		else { /* tokenIdx < patterns->endIdx */
			while(patternIdx + 1 < patterns->endIdx) {
				if(ruleToken->symbol != KSymbol_OptionalGroup && !kToken_Is(MatchPreviousPattern,ruleToken)) {
					errRuleRef[0] = ruleToken;
					errRuleRef[1] = NULL;
					return -1;
				}
				patternIdx++;
				ruleToken = patterns->tokenList->TokenItems[patternIdx];
			}
			return tokenIdx;
		}
	}
	return tokenIdx;
}